

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_scanner.h
# Opt level: O0

void __thiscall CMakeScanner::CMakeScanner(CMakeScanner *this)

{
  int iVar1;
  runtime_error *prVar2;
  CMakeScanner *this_local;
  
  this->yyscanner = (yyscan_t)0x0;
  ScannerCtx::ScannerCtx(&this->scannerCtx);
  this->file = (FILE *)0x0;
  this->stringBuf = (YY_BUFFER_STATE)0x0;
  iVar1 = yylex_init(&this->yyscanner);
  if (iVar1 != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"yylex_init() error");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = yylex_init_extra(&this->scannerCtx,&this->yyscanner);
  if (iVar1 != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"yylex_init_extra() error");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

CMakeScanner()
    {
        if(yylex_init(&yyscanner))
        {
            throw std::runtime_error{"yylex_init() error"};
        }

        if(yylex_init_extra(&scannerCtx, &yyscanner))
        {
            throw std::runtime_error{"yylex_init_extra() error"};
        }
    }